

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

int __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::init
          (SparseTextureClampLookupResidencyTestCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar1;
  value_type_conflict1 local_4e4;
  _Base_ptr local_4e0;
  undefined1 local_4d8;
  value_type_conflict1 local_4cc;
  _Base_ptr local_4c8;
  undefined1 local_4c0;
  value_type_conflict1 local_4b8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  FunctionToken local_468;
  _Base_ptr local_3f8;
  undefined1 local_3f0;
  value_type_conflict1 local_3e4;
  _Base_ptr local_3e0;
  undefined1 local_3d8;
  value_type_conflict1 local_3cc;
  _Base_ptr local_3c8;
  undefined1 local_3c0;
  value_type_conflict1 local_3b4;
  _Base_ptr local_3b0;
  undefined1 local_3a8;
  value_type_conflict1 local_39c;
  _Base_ptr local_398;
  undefined1 local_390;
  value_type_conflict1 local_388;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  FunctionToken local_338;
  _Base_ptr local_2c8;
  undefined1 local_2c0;
  value_type_conflict1 local_2b4;
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  value_type_conflict1 local_29c;
  _Base_ptr local_298;
  undefined1 local_290;
  value_type_conflict1 local_288;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  FunctionToken local_238;
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  value_type_conflict1 local_1b4;
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  value_type_conflict1 local_19c;
  _Base_ptr local_198;
  undefined1 local_190;
  value_type_conflict1 local_184;
  _Base_ptr local_180;
  undefined1 local_178;
  value_type_conflict1 local_16c;
  _Base_ptr local_168;
  undefined1 local_160;
  value_type_conflict1 local_158;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_119;
  string local_118;
  FunctionToken local_f8;
  undefined1 local_88 [8];
  FunctionToken f;
  SparseTextureClampLookupResidencyTestCase *this_local;
  
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x81a5;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mSupportedInternalFormats,
             (value_type_conflict1 *)
             ((long)&f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken((FunctionToken *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"sparseTextureClampARB",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,", <LOD>",&local_151);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_f8,&local_118,&local_150);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_88,&local_f8);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_f8);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  local_158 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_158);
  local_168 = (_Base_ptr)pVar1.first._M_node;
  local_160 = pVar1.second;
  local_16c = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_16c);
  local_180 = (_Base_ptr)pVar1.first._M_node;
  local_178 = pVar1.second;
  local_184 = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_184);
  local_198 = (_Base_ptr)pVar1.first._M_node;
  local_190 = pVar1.second;
  local_19c = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_19c);
  local_1b0 = (_Base_ptr)pVar1.first._M_node;
  local_1a8 = pVar1.second;
  local_1b4 = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_1b4);
  local_1c8 = (_Base_ptr)pVar1.first._M_node;
  local_1c0 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTexture2LookupTestCase).mFunctions,(value_type *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"sparseTextureOffsetClampARB",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_281);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_238,&local_258,&local_280);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_88,&local_238);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_238);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  local_288 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_288);
  local_298 = (_Base_ptr)pVar1.first._M_node;
  local_290 = pVar1.second;
  local_29c = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_29c);
  local_2b0 = (_Base_ptr)pVar1.first._M_node;
  local_2a8 = pVar1.second;
  local_2b4 = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2b4);
  local_2c8 = (_Base_ptr)pVar1.first._M_node;
  local_2c0 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTexture2LookupTestCase).mFunctions,(value_type *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"sparseTextureGradClampARB",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>",&local_381);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_338,&local_358,&local_380);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_88,&local_338);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_338);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  local_388 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_388);
  local_398 = (_Base_ptr)pVar1.first._M_node;
  local_390 = pVar1.second;
  local_39c = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_39c);
  local_3b0 = (_Base_ptr)pVar1.first._M_node;
  local_3a8 = pVar1.second;
  local_3b4 = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_3b4);
  local_3c8 = (_Base_ptr)pVar1.first._M_node;
  local_3c0 = pVar1.second;
  local_3cc = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_3cc);
  local_3e0 = (_Base_ptr)pVar1.first._M_node;
  local_3d8 = pVar1.second;
  local_3e4 = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_3e4);
  local_3f8 = (_Base_ptr)pVar1.first._M_node;
  local_3f0 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTexture2LookupTestCase).mFunctions,(value_type *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"sparseTextureGradOffsetClampARB",&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>"
             ,&local_4b1);
  SparseTexture2LookupTestCase::FunctionToken::FunctionToken(&local_468,&local_488,&local_4b0);
  SparseTexture2LookupTestCase::FunctionToken::operator=((FunctionToken *)local_88,&local_468);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken(&local_468);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  local_4b8 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_4b8);
  local_4c8 = (_Base_ptr)pVar1.first._M_node;
  local_4c0 = pVar1.second;
  local_4cc = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_4cc);
  local_4e0 = (_Base_ptr)pVar1.first._M_node;
  local_4d8 = pVar1.second;
  local_4e4 = 0x806f;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&f.arguments.field_2 + 8),
             &local_4e4);
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&(this->super_SparseTexture2LookupTestCase).mFunctions,(value_type *)local_88);
  SparseTexture2LookupTestCase::FunctionToken::~FunctionToken((FunctionToken *)local_88);
  return extraout_EAX;
}

Assistant:

void SparseTextureClampLookupResidencyTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureClampARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetClampARB", ", <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradClampARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken(
		"sparseTextureGradOffsetClampARB",
		", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0), <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);
}